

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffmkky(char *keyname,char *value,char *comm,char *card,int *status)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  int *in_R8;
  int specialchar;
  int maxlen;
  int ntoken;
  int nblank;
  int tstatus;
  char *saveptr;
  char *cptr;
  char tmpname2 [75];
  char tmpname [75];
  size_t ii;
  size_t len;
  size_t namelen;
  char *local_138;
  char *local_130;
  char *local_128;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_108;
  int local_104;
  int local_100;
  char *local_f0;
  char local_e8 [40];
  int *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char acStack_99 [81];
  char *local_48;
  char *local_40;
  char *local_38;
  int *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  
  local_100 = 0;
  local_104 = 0;
  local_108 = 0;
  bVar1 = false;
  if (0 < *in_R8) {
    return *in_R8;
  }
  acStack_99[1] = '\0';
  local_e8[0] = '\0';
  *in_RCX = '\0';
  for (; *(char *)(in_RDI + local_100) == ' '; local_100 = local_100 + 1) {
  }
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  strncat(acStack_99 + 1,(char *)(in_RDI + local_100),0x4a);
  local_40 = (char *)strlen(local_18);
  local_38 = (char *)strlen(acStack_99 + 1);
  if (local_38 != (char *)0x0) {
    for (local_f0 = acStack_99 + (long)local_38; *local_f0 == ' '; local_f0 = local_f0 + -1) {
      *local_f0 = '\0';
    }
    local_38 = local_f0 + (1 - (long)(acStack_99 + 1));
  }
  pcVar3 = strchr(acStack_99 + 1,0x3d);
  if (pcVar3 != (char *)0x0) {
    ffpmsg((char *)0x16293a);
    ffpmsg((char *)0x162947);
    *local_30 = 0xcf;
    return 0xcf;
  }
  if ((local_38 < (char *)0x9) &&
     (iVar2 = fftkey(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40), iVar2 < 1)) {
    strcat(local_28,acStack_99 + 1);
    for (local_48 = local_38; local_48 < (char *)0x8; local_48 = local_48 + 1) {
      local_28[(long)local_48] = ' ';
    }
    local_28[8] = '=';
    local_28[9] = ' ';
    local_28[10] = '\0';
    local_38 = (char *)0xa;
  }
  else {
    if (acStack_99[1] < 'H') {
      local_110 = -1;
    }
    else {
      if (acStack_99[1] < 'I') {
        local_114 = strncmp(acStack_99 + 1,"HIERARCH ",9);
      }
      else {
        local_114 = 1;
      }
      local_110 = local_114;
    }
    if (local_110 != 0) {
      if (acStack_99[1] < 'h') {
        local_118 = -1;
      }
      else {
        if (acStack_99[1] < 'i') {
          local_11c = strncmp(acStack_99 + 1,"hierarch ",9);
        }
        else {
          local_11c = 1;
        }
        local_118 = local_11c;
      }
      if (local_118 != 0) {
        strncat(local_e8,acStack_99 + 1,0x4a);
        local_f0 = strtok(local_e8," ");
        while (local_f0 != (char *)0x0) {
          sVar4 = strlen(local_f0);
          if ((ulong)(long)local_108 < sVar4) {
            sVar4 = strlen(local_f0);
            local_108 = (int)sVar4;
          }
          iVar2 = fftkey(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
          if (0 < iVar2) {
            bVar1 = true;
          }
          local_f0 = strtok((char *)0x0," ");
          local_104 = local_104 + 1;
        }
        if (local_104 < 1) {
          iVar2 = fftkey(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
          if (0 < iVar2) {
            ffpmsg((char *)0x162d8a);
            ffpmsg((char *)0x162d97);
            *local_30 = 0xcf;
            return 0xcf;
          }
          strncat(local_28,acStack_99 + 1,0x4a);
          strcat(local_28,"= ");
          local_38 = local_38 + 2;
        }
        else {
          if ((char *)0x50 < local_38 + 0xb) {
            ffpmsg((char *)0x162c4a);
            ffpmsg((char *)0x162c57);
            *local_30 = 0xcf;
            return 0xcf;
          }
          strcat(local_28,"HIERARCH ");
          strcat(local_28,acStack_99 + 1);
          if (local_38 + 0xc + (long)local_40 < (char *)0x51) {
            local_38 = local_38 + 9;
            strcat(local_28," = ");
            local_38 = local_38 + 3;
          }
          else {
            local_38 = local_38 + 9;
            strcat(local_28,"= ");
            local_38 = local_38 + 2;
          }
        }
        goto LAB_00162dbb;
      }
    }
    strcat(local_28,acStack_99 + 1);
    if (local_38 + 3 + (long)local_40 < (char *)0x51) {
      strcat(local_28," = ");
      local_38 = local_38 + 3;
    }
    else {
      strcat(local_28,"= ");
      local_38 = local_38 + 2;
    }
  }
LAB_00162dbb:
  if (local_40 == (char *)0x0) {
    if ((local_38 == (char *)0xa) && (local_28[8] = ' ', local_20 != (char *)0x0)) {
      strncat(local_28,local_20,0x46);
    }
  }
  else {
    if (*local_18 == '\'') {
      if ((char *)0x4d < local_38) {
        ffpmsg((char *)0x162df5);
        ffpmsg((char *)0x162e02);
        ffpmsg((char *)0x162e0f);
        *local_30 = 0xcf;
        return 0xcf;
      }
      strncat(local_28,local_18,0x50 - (long)local_38);
      if (local_38 + (long)local_40 < (char *)0x51) {
        local_128 = local_38 + (long)local_40;
      }
      else {
        local_128 = (char *)0x50;
      }
      local_40 = local_128;
      if (local_128 == (char *)0x50) {
        local_28[0x4f] = '\'';
      }
      if (((local_20 != (char *)0x0) && (*local_20 != '\0')) && (local_128 < (char *)0x1e)) {
        for (local_48 = local_128; local_48 < (char *)0x1e; local_48 = local_48 + 1) {
          local_28[(long)local_48] = ' ';
        }
        local_28[0x1e] = '\0';
        local_40 = (char *)0x1e;
      }
    }
    else {
      if ((char *)0x50 < local_38 + (long)local_40) {
        ffpmsg((char *)0x162f5c);
        ffpmsg((char *)0x162f69);
        ffpmsg((char *)0x162f76);
        *local_30 = 0xcf;
        return 0xcf;
      }
      if (local_38 + (long)local_40 < (char *)0x1e) {
        strncat(local_28,"                    ",0x1e - (long)(local_38 + (long)local_40));
      }
      strncat(local_28,local_18,0x50 - (long)local_38);
      if (local_38 + (long)local_40 < (char *)0x51) {
        local_130 = local_38 + (long)local_40;
      }
      else {
        local_130 = (char *)0x50;
      }
      if (local_130 < (char *)0x1e) {
        local_138 = (char *)0x1e;
      }
      else {
        local_138 = local_130;
      }
      local_40 = local_138;
    }
    if (((local_20 != (char *)0x0) && (local_40 < (char *)0x4d)) &&
       (sVar4 = strlen(local_20), sVar4 != 0)) {
      strcat(local_28," / ");
      strncat(local_28,local_20,0x4d - (long)local_40);
    }
  }
  if ((local_104 == 1) || (bVar1)) {
    ffpmsg((char *)0x163139);
    ffpmsg((char *)0x163146);
  }
  return *local_30;
}

Assistant:

int ffmkky(const char *keyname,   /* I - keyword name    */
            char *value,     /* I - keyword value   */
            const char *comm,      /* I - keyword comment */
            char *card,      /* O - constructed keyword card */
            int  *status)    /* IO - status value   */
/*
  Make a complete FITS 80-byte keyword card from the input name, value and
  comment strings. Output card is null terminated without any trailing blanks.
*/
{
    size_t namelen, len, ii;
    char tmpname[FLEN_KEYWORD], tmpname2[FLEN_KEYWORD],*cptr;
    char *saveptr;
    int tstatus = -1, nblank = 0, ntoken = 0, maxlen = 0, specialchar = 0;

    if (*status > 0)
        return(*status);

    *tmpname = '\0';
    *tmpname2 = '\0';
    *card = '\0';

    /* skip leading blanks in the name */
    while(*(keyname + nblank) == ' ')
        nblank++;

    strncat(tmpname, keyname + nblank, FLEN_KEYWORD - 1);

    len = strlen(value);        
    namelen = strlen(tmpname);

    /* delete non-significant trailing blanks in the name */
    if (namelen) {
        cptr = tmpname + namelen - 1;

        while(*cptr == ' ') {
            *cptr = '\0';
            cptr--;
        }

        namelen = cptr - tmpname + 1;
    }
    
    /* check that the name does not contain an '=' (equals sign) */
    if (strchr(tmpname, '=') ) {
        ffpmsg("Illegal keyword name; contains an equals sign (=)");
        ffpmsg(tmpname);
        return(*status = BAD_KEYCHAR);
    }

    if (namelen <= 8 && fftkey(tmpname, &tstatus) <= 0 ) { 
    
        /* a normal 8-char (or less) FITS keyword. */
        strcat(card, tmpname);   /* copy keyword name to buffer */
   
        for (ii = namelen; ii < 8; ii++)
            card[ii] = ' ';      /* pad keyword name with spaces */

        card[8]  = '=';          /* append '= ' in columns 9-10 */
        card[9]  = ' ';
        card[10] = '\0';        /* terminate the partial string */
        namelen = 10;
    } else if ((FSTRNCMP(tmpname, "HIERARCH ", 9) == 0) || 
               (FSTRNCMP(tmpname, "hierarch ", 9) == 0) ) {

        /* this is an explicit ESO HIERARCH keyword */

        strcat(card, tmpname);  /* copy keyword name to buffer */

        if (namelen + 3 + len > 80) {
            /* save 1 char by not putting a space before the equals sign */
            strcat(card, "= ");
            namelen += 2;
        } else {
            strcat(card, " = ");
            namelen += 3;
        }
    } else {

	/* scan the keyword name to determine the number and max length of the tokens */
	/* and test if any of the tokens contain nonstandard characters */
	
      	strncat(tmpname2, tmpname, FLEN_KEYWORD - 1);
        cptr = ffstrtok(tmpname2, " ",&saveptr);
	while (cptr) {
	    if (strlen(cptr) > maxlen) maxlen = strlen(cptr); /* find longest token */

	    /* name contains special characters? */
            tstatus = -1;  /* suppress any error message */
	    if (fftkey(cptr, &tstatus) > 0) specialchar = 1; 
	    
	    cptr = ffstrtok(NULL, " ",&saveptr);
	    ntoken++;
	}

        tstatus = -1;  /* suppress any error message */

/*      if (ntoken > 1) { */
        if (ntoken > 0) {  /*  temporarily change so that this case should always be true  */
	    /* for now at least, treat all cases as an implicit ESO HIERARCH keyword. */
	    /* This could  change if FITS is ever expanded to directly support longer keywords. */
	    
            if (namelen + 11 > FLEN_CARD-1)
            {
                ffpmsg(
               "The following keyword is too long to fit on a card:");
                ffpmsg(keyname);
                return(*status = BAD_KEYCHAR);
            }
            strcat(card, "HIERARCH ");
            strcat(card, tmpname);
	    namelen += 9;

            if (namelen + 3 + len > 80) {
                /* save 1 char by not putting a space before the equals sign */
                strcat(card, "= ");
                namelen += 2;
            } else {
                strcat(card, " = ");
                namelen += 3;
            }

	} else if ((fftkey(tmpname, &tstatus) <= 0)) {
          /* should never get here (at least for now) */
            /* allow keyword names longer than 8 characters */

            strncat(card, tmpname, FLEN_KEYWORD - 1);
            strcat(card, "= ");
            namelen += 2;
        } else {
          /* should never get here (at least for now) */
            ffpmsg("Illegal keyword name:");
            ffpmsg(tmpname);
            return(*status = BAD_KEYCHAR);
        }
    }

    if (len > 0)  /* now process the value string */
    {
        if (value[0] == '\'')  /* is this a quoted string value? */
        {
            if (namelen > 77)
            {
                ffpmsg(
               "The following keyword + value is too long to fit on a card:");
                ffpmsg(keyname);
                ffpmsg(value);
                return(*status = BAD_KEYCHAR);
            }

            strncat(card, value, 80 - namelen); /* append the value string */
            len = minvalue(80, namelen + len);

            /* restore the closing quote if it got truncated */
            if (len == 80)
            {
                   card[79] = '\'';
            }

            if (comm)
            {
              if (comm[0] != 0)
              {
                if (len < 30)
                {
                  for (ii = len; ii < 30; ii++)
                    card[ii] = ' '; /* fill with spaces to col 30 */

                  card[30] = '\0';
                  len = 30;
                }
              }
            }
        }
        else
        {
            if (namelen + len > 80)
            {
                ffpmsg(
               "The following keyword + value is too long to fit on a card:");
                ffpmsg(keyname);
                ffpmsg(value);
                return(*status = BAD_KEYCHAR);
            }
            else if (namelen + len < 30)
            {
                /* add spaces so field ends at least in col 30 */
                strncat(card, "                    ", 30 - (namelen + len));
            }

            strncat(card, value, 80 - namelen); /* append the value string */
            len = minvalue(80, namelen + len);
            len = maxvalue(30, len);
        }

        if (comm)
        {
          if ((len < 77) && ( strlen(comm) > 0) )  /* room for a comment? */
          {
            strcat(card, " / ");   /* append comment separator */
            strncat(card, comm, 77 - len); /* append comment (what fits) */
          } 
        }
    }
    else
    {
      if (namelen == 10)  /* This case applies to normal keywords only */
      {
        card[8] = ' '; /* keywords with no value have no '=' */ 
        if (comm)
        {
          strncat(card, comm, 80 - namelen); /* append comment (what fits) */
        }
      }
    }

    /* issue a warning if this keyword does not strictly conform to the standard
	       HIERARCH convention, which requires,
	         1) at least 2 tokens in the name,
		 2) no tokens longer than 8 characters, and
		 3) no special characters in any of the tokens */

            if (ntoken == 1 || specialchar == 1) {
	       ffpmsg("Warning: the following keyword does not conform to the HIERARCH convention");
	     /*  ffpmsg(" (e.g., name is not hierarchical or contains non-standard characters)."); */
	       ffpmsg(card);
	    }

    return(*status);
}